

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int setChildPtrmaps(MemPage *pPage)

{
  u8 uVar1;
  u8 uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  BtShared *pBt;
  u8 *puVar6;
  int iVar7;
  ulong uVar8;
  int rc;
  undefined8 local_38;
  
  pBt = pPage->pBt;
  local_38._4_4_ = pPage->pgno;
  if (pPage->isInit == '\0') {
    iVar7 = btreeInitPage(pPage);
    local_38 = CONCAT44(local_38._4_4_,iVar7);
    if (iVar7 != 0) {
      return iVar7;
    }
  }
  else {
    local_38 = (ulong)local_38._4_4_ << 0x20;
  }
  uVar3 = pPage->nCell;
  if ((ulong)uVar3 != 0) {
    uVar8 = 0;
    do {
      uVar4 = pPage->maskPage;
      uVar1 = pPage->aCellIdx[uVar8 * 2];
      uVar2 = pPage->aCellIdx[uVar8 * 2 + 1];
      puVar6 = pPage->aData;
      ptrmapPutOvflPtr(pPage,puVar6 + (CONCAT11(uVar1,uVar2) & uVar4),(int *)&local_38);
      if (pPage->leaf == '\0') {
        uVar5 = *(uint *)(puVar6 + (CONCAT11(uVar1,uVar2) & uVar4));
        ptrmapPut(pBt,uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                      uVar5 << 0x18,'\x05',local_38._4_4_,(int *)&local_38);
      }
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  if (pPage->leaf == '\0') {
    uVar5 = *(uint *)(pPage->aData + (ulong)pPage->hdrOffset + 8);
    ptrmapPut(pBt,uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18,
              '\x05',local_38._4_4_,(int *)&local_38);
  }
  return (int)local_38;
}

Assistant:

static int setChildPtrmaps(MemPage *pPage){
  int i;                             /* Counter variable */
  int nCell;                         /* Number of cells in page pPage */
  int rc;                            /* Return code */
  BtShared *pBt = pPage->pBt;
  Pgno pgno = pPage->pgno;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  rc = pPage->isInit ? SQLITE_OK : btreeInitPage(pPage);
  if( rc!=SQLITE_OK ) return rc;
  nCell = pPage->nCell;

  for(i=0; i<nCell; i++){
    u8 *pCell = findCell(pPage, i);

    ptrmapPutOvflPtr(pPage, pCell, &rc);

    if( !pPage->leaf ){
      Pgno childPgno = get4byte(pCell);
      ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
    }
  }

  if( !pPage->leaf ){
    Pgno childPgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
  }

  return rc;
}